

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_alg(uchar **p,uchar *end,mbedtls_asn1_buf *alg,mbedtls_asn1_buf *params)

{
  uchar *puVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t len;
  
  iVar2 = mbedtls_asn1_get_tag(p,end,&len,0x30);
  if (iVar2 == 0) {
    pbVar4 = *p;
    if (end == pbVar4 || (long)end - (long)pbVar4 < 0) {
      iVar2 = -0x60;
    }
    else {
      alg->tag = (uint)*pbVar4;
      pbVar4 = pbVar4 + len;
      iVar2 = mbedtls_asn1_get_tag(p,pbVar4,&alg->len,6);
      if (iVar2 == 0) {
        puVar1 = *p;
        alg->p = puVar1;
        pbVar3 = puVar1 + alg->len;
        *p = pbVar3;
        if (pbVar3 == pbVar4) {
          mbedtls_platform_zeroize(params,0x18);
          iVar2 = 0;
        }
        else {
          params->tag = (uint)*pbVar3;
          *p = pbVar3 + 1;
          iVar2 = mbedtls_asn1_get_len(p,pbVar4,&params->len);
          if (iVar2 == 0) {
            puVar1 = *p;
            params->p = puVar1;
            pbVar3 = puVar1 + params->len;
            *p = pbVar3;
            iVar2 = -0x66;
            if (pbVar3 == pbVar4) {
              iVar2 = 0;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_alg( unsigned char **p,
                  const unsigned char *end,
                  mbedtls_asn1_buf *alg, mbedtls_asn1_buf *params )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    alg->tag = **p;
    end = *p + len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &alg->len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( ret );

    alg->p = *p;
    *p += alg->len;

    if( *p == end )
    {
        mbedtls_platform_zeroize( params, sizeof(mbedtls_asn1_buf) );
        return( 0 );
    }

    params->tag = **p;
    (*p)++;

    if( ( ret = mbedtls_asn1_get_len( p, end, &params->len ) ) != 0 )
        return( ret );

    params->p = *p;
    *p += params->len;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}